

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AC3DImporter::ConvertMaterial
          (AC3DImporter *this,Object *object,Material *matSrc,aiMaterial *matDest)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  aiReturn aVar6;
  int iVar7;
  undefined1 auVar8 [16];
  float f;
  int n;
  undefined1 auStack_444 [12];
  ai_real local_438;
  aiString s;
  
  s.length = 0;
  s.data[0] = '\0';
  memset(s.data + 1,0x1b,0x3ff);
  uVar5 = (matSrc->name)._M_string_length;
  if (uVar5 != 0) {
    if (uVar5 < 0x400) {
      s.length = (ai_uint32)uVar5;
      memcpy(s.data,(matSrc->name)._M_dataplus._M_p,uVar5);
      s.data[uVar5] = '\0';
    }
    aiMaterial::AddProperty(matDest,&s,"?mat.name",0,0);
  }
  uVar5 = (object->texture)._M_string_length;
  if (uVar5 != 0) {
    if (uVar5 < 0x400) {
      s.length = (ai_uint32)uVar5;
      memcpy(s.data,(object->texture)._M_dataplus._M_p,uVar5);
      s.data[uVar5] = '\0';
    }
    aVar6 = aiMaterial::AddProperty(matDest,&s,"$tex.file",1,0);
    auVar8._4_4_ = -(uint)((object->texRepeat).y != 1.0);
    auVar8._0_4_ = -(uint)((object->texRepeat).x != 1.0);
    auVar8._8_4_ = -(uint)((object->texOffset).x != 0.0);
    auVar8._12_4_ = -(uint)((object->texOffset).y != 0.0);
    iVar7 = movmskps(aVar6,auVar8);
    if (iVar7 != 0) {
      local_438 = 0.0;
      uVar1 = (object->texRepeat).x;
      uVar2 = (object->texRepeat).y;
      uVar3 = (object->texOffset).x;
      uVar4 = (object->texOffset).y;
      register0x00001204 = uVar4;
      n = uVar3;
      register0x00001208 = uVar1;
      register0x0000120c = uVar2;
      aiMaterial::AddProperty(matDest,(aiUVTransform *)&n,1,"$tex.uvtrafo",1,0);
    }
  }
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->rgb,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->amb,1,"$clr.ambient",0,0);
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->emis,1,"$clr.emissive",0,0);
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->spec,1,"$clr.specular",0,0);
  if ((matSrc->shin != 0.0) || (NAN(matSrc->shin))) {
    n = 3;
    aiMaterial::AddProperty<float>(matDest,&matSrc->shin,1,"$mat.shininess",0,0);
  }
  else {
    n = 2;
  }
  aiMaterial::AddProperty<int>(matDest,&n,1,"$mat.shadingm",0,0);
  f = 1.0 - matSrc->trans;
  aiMaterial::AddProperty<float>(matDest,&f,1,"$mat.opacity",0,0);
  return;
}

Assistant:

void AC3DImporter::ConvertMaterial(const Object& object,
    const Material& matSrc,
    aiMaterial& matDest)
{
    aiString s;

    if (matSrc.name.length())
    {
        s.Set(matSrc.name);
        matDest.AddProperty(&s,AI_MATKEY_NAME);
    }
    if (object.texture.length())
    {
        s.Set(object.texture);
        matDest.AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));

        // UV transformation
        if (1.f != object.texRepeat.x || 1.f != object.texRepeat.y ||
            object.texOffset.x        || object.texOffset.y)
        {
            aiUVTransform transform;
            transform.mScaling = object.texRepeat;
            transform.mTranslation = object.texOffset;
            matDest.AddProperty(&transform,1,AI_MATKEY_UVTRANSFORM_DIFFUSE(0));
        }
    }

    matDest.AddProperty<aiColor3D>(&matSrc.rgb,1, AI_MATKEY_COLOR_DIFFUSE);
    matDest.AddProperty<aiColor3D>(&matSrc.amb,1, AI_MATKEY_COLOR_AMBIENT);
    matDest.AddProperty<aiColor3D>(&matSrc.emis,1,AI_MATKEY_COLOR_EMISSIVE);
    matDest.AddProperty<aiColor3D>(&matSrc.spec,1,AI_MATKEY_COLOR_SPECULAR);

    int n;
    if (matSrc.shin)
    {
        n = aiShadingMode_Phong;
        matDest.AddProperty<float>(&matSrc.shin,1,AI_MATKEY_SHININESS);
    }
    else n = aiShadingMode_Gouraud;
    matDest.AddProperty<int>(&n,1,AI_MATKEY_SHADING_MODEL);

    float f = 1.f - matSrc.trans;
    matDest.AddProperty<float>(&f,1,AI_MATKEY_OPACITY);
}